

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O3

void __thiscall Shell::NewCNF::NewCNF(NewCNF *this,uint namingThreshold)

{
  Formula **ppFVar1;
  double dVar2;
  
  this->_namingThreshold = namingThreshold;
  dVar2 = log2((double)namingThreshold);
  dVar2 = ceil(dVar2);
  this->_iteInliningThreshold = (uint)(long)dVar2;
  (this->_queue)._capacity = 8;
  ppFVar1 = (Formula **)
            Lib::FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  (this->_queue)._data = ppFVar1;
  (this->_queue)._front = ppFVar1;
  (this->_queue)._back = ppFVar1;
  (this->_queue)._end = ppFVar1 + (this->_queue)._capacity;
  (this->_bindingStore)._stored._capacity = 0;
  (this->_bindingStore)._stored._stack = (List<std::pair<unsigned_int,_Kernel::Term_*>_> **)0x0;
  (this->_bindingStore)._stored._cursor = (List<std::pair<unsigned_int,_Kernel::Term_*>_> **)0x0;
  (this->_bindingStore)._stored._end = (List<std::pair<unsigned_int,_Kernel::Term_*>_> **)0x0;
  (this->_foolBindingStore)._stored._capacity = 0;
  (this->_foolBindingStore)._stored._stack = (List<std::pair<unsigned_int,_Kernel::Term_*>_> **)0x0;
  (this->_foolBindingStore)._stored._cursor = (List<std::pair<unsigned_int,_Kernel::Term_*>_> **)0x0
  ;
  (this->_foolBindingStore)._stored._end = (List<std::pair<unsigned_int,_Kernel::Term_*>_> **)0x0;
  (this->_literalsCache)._timestamp = 1;
  (this->_literalsCache)._size = 0;
  (this->_literalsCache)._deleted = 0;
  (this->_literalsCache)._capacityIndex = 0;
  (this->_literalsCache)._capacity = 0;
  *(undefined8 *)&(this->_literalsCache)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_literalsCache)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_literalsCache)._afterLast + 4) = 0x100000000;
  (this->_formulasCache)._size = 0;
  (this->_formulasCache)._deleted = 0;
  (this->_formulasCache)._capacityIndex = 0;
  (this->_formulasCache)._capacity = 0;
  *(undefined8 *)&(this->_formulasCache)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_formulasCache)._entries + 4) = 0;
  *(undefined4 *)((long)&(this->_formulasCache)._afterLast + 4) = 0;
  (this->_genClauses).
  super__List_base<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_genClauses;
  (this->_genClauses).
  super__List_base<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_genClauses;
  (this->_genClauses).
  super__List_base<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->_occurrences)._timestamp = 1;
  *(undefined8 *)((long)&(this->_occurrences)._afterLast + 4) = 0x100000000;
  *(undefined8 *)&(this->_occurrences)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_occurrences)._entries + 4) = 0;
  (this->_occurrences)._size = 0;
  (this->_occurrences)._deleted = 0;
  (this->_occurrences)._capacityIndex = 0;
  (this->_occurrences)._capacity = 0;
  this->_maxVar = 0;
  this->_forInduction = false;
  (this->_varSorts)._size = 0;
  (this->_varSorts)._deleted = 0;
  (this->_varSorts)._capacityIndex = 0;
  (this->_varSorts)._capacity = 0;
  *(undefined8 *)&(this->_varSorts)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_varSorts)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_varSorts)._afterLast + 1) = 0;
  (this->_freeVars)._timestamp = 1;
  *(undefined8 *)&(this->_freeVars)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_freeVars)._entries + 4) = 0;
  (this->_freeVars)._size = 0;
  (this->_freeVars)._deleted = 0;
  (this->_freeVars)._capacityIndex = 0;
  (this->_freeVars)._capacity = 0;
  *(undefined8 *)((long)&(this->_freeVars)._afterLast + 4) = 0x100000000;
  *(undefined8 *)&(this->_skolemsByBindings)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_skolemsByBindings)._entries + 4) = 0;
  (this->_skolemsByBindings)._size = 0;
  (this->_skolemsByBindings)._deleted = 0;
  (this->_skolemsByBindings)._capacityIndex = 0;
  (this->_skolemsByBindings)._capacity = 0;
  *(undefined8 *)((long)&(this->_skolemsByBindings)._afterLast + 4) = 0x100000000;
  *(undefined4 *)((long)&(this->_skolemsByFreeVars)._afterLast + 4) = 0;
  *(undefined8 *)&(this->_skolemsByFreeVars)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_skolemsByFreeVars)._entries + 4) = 0;
  (this->_skolemsByFreeVars)._size = 0;
  (this->_skolemsByFreeVars)._deleted = 0;
  (this->_skolemsByFreeVars)._capacityIndex = 0;
  (this->_skolemsByFreeVars)._capacity = 0;
  (this->_foolSkolemsByBindings)._timestamp = 1;
  *(undefined4 *)((long)&(this->_foolSkolemsByBindings)._afterLast + 4) = 0;
  *(undefined8 *)&(this->_foolSkolemsByBindings)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_foolSkolemsByBindings)._entries + 4) = 0;
  (this->_foolSkolemsByBindings)._size = 0;
  (this->_foolSkolemsByBindings)._deleted = 0;
  (this->_foolSkolemsByBindings)._capacityIndex = 0;
  (this->_foolSkolemsByBindings)._capacity = 0;
  (this->_foolSkolemsByFreeVars)._timestamp = 1;
  *(undefined4 *)((long)&(this->_foolSkolemsByFreeVars)._afterLast + 4) = 0;
  *(undefined8 *)&(this->_foolSkolemsByFreeVars)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_foolSkolemsByFreeVars)._entries + 4) = 0;
  (this->_foolSkolemsByFreeVars)._size = 0;
  (this->_foolSkolemsByFreeVars)._deleted = 0;
  (this->_foolSkolemsByFreeVars)._capacityIndex = 0;
  (this->_foolSkolemsByFreeVars)._capacity = 0;
  (this->_substitutionsByBindings)._timestamp = 1;
  *(undefined4 *)((long)&(this->_substitutionsByBindings)._afterLast + 4) = 0;
  *(undefined8 *)&(this->_substitutionsByBindings)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_substitutionsByBindings)._entries + 4) = 0;
  (this->_substitutionsByBindings)._size = 0;
  (this->_substitutionsByBindings)._deleted = 0;
  (this->_substitutionsByBindings)._capacityIndex = 0;
  (this->_substitutionsByBindings)._capacity = 0;
  return;
}

Assistant:

NewCNF(unsigned namingThreshold)
    : _namingThreshold(namingThreshold), _iteInliningThreshold((unsigned)ceil(log2(namingThreshold))),
      _collectedVarSorts(false), _maxVar(0),_forInduction(false) {}